

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O2

int send_tcp_close(proxy_conn_handle *pc)

{
  undefined8 *puVar1;
  int iVar2;
  uint8_t local_21 [9];
  
  puVar1 = (undefined8 *)pc->priv;
  local_21[1] = '\0';
  local_21[2] = '\0';
  local_21[3] = '\0';
  local_21[4] = '\0';
  local_21[5] = '\0';
  local_21[6] = '\0';
  local_21[7] = '\0';
  local_21[8] = '\0';
  local_21[0] = '\x03';
  proxy_log(pc->ph,LOG_LEVEL_DEBUG,"Sending TCP_CLOSE message to client \'%s\'\n",puVar1 + 0x21b);
  mutex_lock((mutex_handle *)(puVar1 + 0xe));
  conn_send((conn_handle *)*puVar1,local_21,9);
  iVar2 = mutex_unlock((mutex_handle *)(puVar1 + 0xe));
  return iVar2;
}

Assistant:

static int send_tcp_close(struct proxy_conn_handle *pc)
{
	struct proxy_conn_priv *priv = pc->priv;
	struct proxy_msg message = { 0 };
	int ret;

	message.type = PROXY_MSG_TYPE_TCP_CLOSE;
	message.size = 0;

	proxy_log(pc->ph, LOG_LEVEL_DEBUG,
		  "Sending TCP_CLOSE message to client '%s'\n", priv->callsign);

	mutex_lock(&priv->mutex_client_send);

	ret = conn_send(priv->conn_client, (uint8_t *)&message,
			sizeof(struct proxy_msg));

	mutex_unlock(&priv->mutex_client_send);

	return ret;
}